

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getColorFormatStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int numComponents,bool isUint,
          bool isSint)

{
  ostream *poVar1;
  char *local_1c0;
  char *local_1b8;
  ostringstream local_190 [8];
  ostringstream str;
  bool isSint_local;
  bool isUint_local;
  int numComponents_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if ((int)this == 1) {
    if ((numComponents & 1U) == 0) {
      local_1b8 = "float";
      if (isUint) {
        local_1b8 = "int";
      }
    }
    else {
      local_1b8 = "uint";
    }
    std::operator<<((ostream *)local_190,local_1b8);
  }
  else {
    if ((numComponents & 1U) == 0) {
      local_1c0 = "";
      if (isUint) {
        local_1c0 = "i";
      }
    }
    else {
      local_1c0 = "u";
    }
    poVar1 = std::operator<<((ostream *)local_190,local_1c0);
    poVar1 = std::operator<<(poVar1,"vec");
    std::ostream::operator<<(poVar1,(int)this);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getColorFormatStr (const int numComponents, const bool isUint, const bool isSint)
{
	std::ostringstream str;
	if (numComponents == 1)
		str << (isUint ? "uint" : isSint ? "int" : "float");
	else
		str << (isUint ? "u" : isSint ? "i" : "") << "vec" << numComponents;

	return str.str();
}